

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

void __thiscall
SmallDenseMap<GenericFunctionInstanceTypeRequest,_GenericFunctionInstanceTypeResponse,_GenericFunctionInstanceTypeRequestHasher,_32U>
::insert(SmallDenseMap<GenericFunctionInstanceTypeRequest,_GenericFunctionInstanceTypeResponse,_GenericFunctionInstanceTypeRequestHasher,_32U>
         *this,GenericFunctionInstanceTypeRequest *key,GenericFunctionInstanceTypeResponse *value)

{
  Node *pNVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  GenericFunctionInstanceTypeRequest local_a8;
  Node *local_70;
  Node *item;
  uint i;
  uint local_5c;
  uint bucket;
  uint bucketMask;
  GenericFunctionInstanceTypeResponse *local_20;
  GenericFunctionInstanceTypeResponse *value_local;
  GenericFunctionInstanceTypeRequest *key_local;
  SmallDenseMap<GenericFunctionInstanceTypeRequest,_GenericFunctionInstanceTypeResponse,_GenericFunctionInstanceTypeRequestHasher,_32U>
  *this_local;
  
  local_20 = value;
  value_local = (GenericFunctionInstanceTypeResponse *)key;
  key_local = (GenericFunctionInstanceTypeRequest *)this;
  GenericFunctionInstanceTypeRequest::GenericFunctionInstanceTypeRequest
            ((GenericFunctionInstanceTypeRequest *)&bucket);
  bVar2 = GenericFunctionInstanceTypeRequest::operator!=
                    (key,(GenericFunctionInstanceTypeRequest *)&bucket);
  if (!bVar2) {
    __assert_fail("key != Key()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                  ,0x3b,
                  "void SmallDenseMap<GenericFunctionInstanceTypeRequest, GenericFunctionInstanceTypeResponse, GenericFunctionInstanceTypeRequestHasher, 32>::insert(const Key &, const Value &) [Key = GenericFunctionInstanceTypeRequest, Value = GenericFunctionInstanceTypeResponse, Hasher = GenericFunctionInstanceTypeRequestHasher, N = 32]"
                 );
  }
  if (this->bucketCount <= this->count + (this->count >> 2)) {
    rehash(this);
  }
  local_5c = this->bucketCount - 1;
  uVar3 = GenericFunctionInstanceTypeRequestHasher::operator()
                    ((GenericFunctionInstanceTypeRequestHasher *)((long)&item + 7),
                     (GenericFunctionInstanceTypeRequest *)value_local);
  i = uVar3 & local_5c;
  item._0_4_ = 0;
  while( true ) {
    if (this->bucketCount <= (uint)item) {
      __assert_fail("!\"couldn\'t insert node\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                    ,0x5b,
                    "void SmallDenseMap<GenericFunctionInstanceTypeRequest, GenericFunctionInstanceTypeResponse, GenericFunctionInstanceTypeRequestHasher, 32>::insert(const Key &, const Value &) [Key = GenericFunctionInstanceTypeRequest, Value = GenericFunctionInstanceTypeResponse, Hasher = GenericFunctionInstanceTypeRequestHasher, N = 32]"
                   );
    }
    pNVar1 = this->data;
    uVar4 = (ulong)i;
    local_70 = pNVar1 + uVar4;
    GenericFunctionInstanceTypeRequest::GenericFunctionInstanceTypeRequest(&local_a8);
    bVar2 = GenericFunctionInstanceTypeRequest::operator==(&pNVar1[uVar4].key,&local_a8);
    if (bVar2) break;
    bVar2 = GenericFunctionInstanceTypeRequest::operator==
                      (&local_70->key,(GenericFunctionInstanceTypeRequest *)value_local);
    if (bVar2) {
      (local_70->value).functionType = local_20->functionType;
      (local_70->value).aliases.head = (local_20->aliases).head;
      (local_70->value).aliases.tail = (local_20->aliases).tail;
      return;
    }
    i = i + (uint)item + 1 & local_5c;
    item._0_4_ = (uint)item + 1;
  }
  memcpy(local_70,value_local,0x38);
  (local_70->value).functionType = local_20->functionType;
  (local_70->value).aliases.head = (local_20->aliases).head;
  (local_70->value).aliases.tail = (local_20->aliases).tail;
  this->count = this->count + 1;
  return;
}

Assistant:

void insert(const Key& key, const Value& value)
	{
		// Default value is used as an empty marker
		assert(key != Key());

		// Keep occupancy at <80%
		if(count + (count >> 2) >= bucketCount)
			rehash();

		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Node &item = data[bucket];

			if(item.key == Key())
			{
				item.key = key;
				item.value = value;

				count++;
				return;
			}

			if(item.key == key)
			{
				item.value = value;
				return;
			}

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		assert(!"couldn't insert node");
	}